

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspAppBase::run(ClaspAppBase *this,ClaspFacade *clasp)

{
  bool bVar1;
  istream *str;
  ssize_t sVar2;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  ClaspFacade *prg;
  ModelHandler local_28;
  SatPrePtr SStack_20;
  
  str = getStream(this,false);
  ClaspFacade::start(clasp,&(this->claspConfig_).super_ClaspConfig,str);
  prg = clasp;
  handleStartOptions(this,clasp);
  __buf = extraout_RDX;
  while( true ) {
    sVar2 = ClaspFacade::read(clasp,(int)prg,__buf,in_RCX);
    if ((char)sVar2 == '\0') break;
    prg = (ClaspFacade *)((clasp->builder_).ptr_ & 0xfffffffffffffffe);
    bVar1 = handlePostGroundOptions(this,(ProgramBuilder *)prg);
    __buf = extraout_RDX_00;
    if (bVar1) {
      ClaspFacade::prepare(clasp,enum_volatile);
      handlePreSolveOptions(this,clasp);
      local_28._vptr_ModelHandler = (_func_int **)0x0;
      SStack_20.ptr_ = 0;
      prg = (ClaspFacade *)&stack0xffffffffffffffd8;
      ClaspFacade::solve(clasp,(LitVec *)&stack0xffffffffffffffd8,(EventHandler *)0x0);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo
                ((ebo *)&stack0xffffffffffffffd8);
      __buf = extraout_RDX_01;
    }
  }
  return;
}

Assistant:

void ClaspAppBase::run(ClaspFacade& clasp) {
	clasp.start(claspConfig_, getStream());
	handleStartOptions(clasp);
	while (clasp.read()) {
		if (handlePostGroundOptions(*clasp.program())) {
			clasp.prepare();
			if (handlePreSolveOptions(clasp)) { clasp.solve(); }
		}
	}
}